

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

void google::protobuf::compiler::java::EscapeUtf16ToString(uint16_t code,string *output)

{
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355> local_48;
  string local_38;
  string *local_18;
  string *output_local;
  uint16_t code_local;
  
  local_18 = output;
  output_local._6_2_ = code;
  if (code == 9) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 8) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 10) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 0xd) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 0xc) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 0x27) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 0x22) {
    std::__cxx11::string::append((char *)output);
  }
  else if (code == 0x5c) {
    std::__cxx11::string::append((char *)output);
  }
  else if ((code < 0x20) || (0x7f < code)) {
    absl::lts_20250127::str_format_internal::
    FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_48,"\\u%04x");
    absl::lts_20250127::StrFormat<unsigned_short>
              (&local_38,&local_48,(unsigned_short *)((long)&output_local + 6));
    std::__cxx11::string::append((string *)output);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::push_back((char)output);
  }
  return;
}

Assistant:

void EscapeUtf16ToString(uint16_t code, std::string* output) {
  if (code == '\t') {
    output->append("\\t");
  } else if (code == '\b') {
    output->append("\\b");
  } else if (code == '\n') {
    output->append("\\n");
  } else if (code == '\r') {
    output->append("\\r");
  } else if (code == '\f') {
    output->append("\\f");
  } else if (code == '\'') {
    output->append("\\'");
  } else if (code == '\"') {
    output->append("\\\"");
  } else if (code == '\\') {
    output->append("\\\\");
  } else if (code >= 0x20 && code <= 0x7f) {
    output->push_back(static_cast<char>(code));
  } else {
    output->append(absl::StrFormat("\\u%04x", code));
  }
}